

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<int,int,int>>
::operator()(BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<int,int,int>>
             *this,int it)

{
  reference piVar1;
  reference piVar2;
  
  piVar1 = View<int,true,std::allocator<unsigned_long>>::operator()
                     (*(View<int,true,std::allocator<unsigned_long>> **)this,it);
  piVar2 = View<int,true,std::allocator<unsigned_long>>::operator()
                     (*(View<int,true,std::allocator<unsigned_long>> **)(this + 8),it);
  return *piVar1 - *piVar2;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }